

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O0

shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
 nonsugar::detail::
 copy_shared<nonsugar::option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>>
           (option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *t)

{
  shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sVar1;
  option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *t_local;
  
  sVar1 = std::
          make_shared<nonsugar::option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>,nonsugar::option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>const&>
                    (t);
  sVar1.
  super___shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = t;
  return (shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )sVar1.
           super___shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

inline std::shared_ptr<T> copy_shared(T const &t)
{
    return std::make_shared<T>(t);
}